

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<const_QWidget_*,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>>::findNode<QWidget_const*>
          (Data<QHashPrivate::Node<const_QWidget_*,_QHashDummyValue>_> *this,QWidget **key)

{
  long lVar1;
  bool bVar2;
  Node<const_QWidget_*,_QHashDummyValue> *pNVar3;
  QWidget **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<const_QWidget_*,_QHashDummyValue>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QWidget_const*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<const_QWidget_*,_QHashDummyValue>_>::Bucket::isUnused
                    ((Bucket *)0x4776db);
  if (bVar2) {
    pNVar3 = (Node<const_QWidget_*,_QHashDummyValue> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<const_QWidget_*,_QHashDummyValue>_>::Bucket::node
                       ((Bucket *)0x4776f6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }